

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,int field_index,int field_count,Reflection *reflection,
          FieldDescriptor *field,BaseTextGenerator *generator)

{
  Nonnull<char_*> pcVar1;
  FastFieldValuePrinter *pFVar2;
  long *local_78;
  undefined8 local_70;
  long local_68 [2];
  long local_58;
  Nonnull<char_*> local_50;
  char local_48 [32];
  
  if (this->use_field_number_ == true) {
    pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(field->number_,local_48);
    local_58 = (long)pcVar1 - (long)local_48;
    local_78 = local_68;
    local_50 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,local_48,pcVar1);
    (*generator->_vptr_BaseTextGenerator[5])(generator,local_78,local_70);
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
    return;
  }
  pFVar2 = GetFieldPrinter(this,field);
  (*pFVar2->_vptr_FastFieldValuePrinter[0xc])
            (pFVar2,message,(ulong)(uint)field_index,(ulong)(uint)field_count,reflection,field);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         int field_index, int field_count,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         BaseTextGenerator* generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator->PrintString(absl::StrCat(field->number()));
    return;
  }

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  printer->PrintFieldName(message, field_index, field_count, reflection, field,
                          generator);
}